

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_2,_2,_5>::evaluate
               (ShaderEvalContext *evalCtx)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  float *pfVar5;
  Vector<float,_2> *pVVar6;
  bool bVar7;
  long lVar8;
  float v;
  float fVar9;
  float fVar10;
  float local_3c [5];
  Mat2 m;
  int aiStack_18 [6];
  
  fVar1 = (evalCtx->coords).m_data[0];
  fVar2 = (evalCtx->coords).m_data[1];
  m.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
  m.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
  m.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
  m.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
  local_3c[1] = 0.0;
  local_3c[0] = 0.0;
  pfVar5 = local_3c + 1;
  pVVar6 = (Vector<float,_2> *)&m;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    fVar9 = 0.0;
    lVar8 = 0;
    fVar10 = fVar1;
    bVar3 = true;
    do {
      bVar7 = bVar3;
      fVar9 = fVar9 + fVar10 * pVVar6->m_data[lVar8];
      lVar8 = 1;
      fVar10 = fVar2;
      bVar3 = false;
    } while (bVar7);
    *pfVar5 = fVar9;
    pfVar5 = local_3c;
    pVVar6 = m.m_data.m_data + 1;
    bVar3 = false;
  } while (bVar4);
  local_3c[2] = local_3c[1];
  local_3c[3] = local_3c[0];
  local_3c[4] = local_3c[1];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar8 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar8]] = local_3c[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 5);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }